

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

void Gla_ManCollect(Gla_Man_t *p,Vec_Int_t *vPis,Vec_Int_t *vPPis,Vec_Int_t *vCos,Vec_Int_t *vRoAnds
                   )

{
  Gia_Man_t *pGVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  undefined8 uVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  Gla_Obj_t *pGVar9;
  long lVar10;
  uint uVar11;
  Gla_Obj_t *pGVar12;
  long lVar13;
  ulong uVar14;
  
  pGVar1 = p->pGia;
  iVar8 = pGVar1->vCos->nSize;
  if (iVar8 <= pGVar1->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar8 < 1) {
LAB_0058776d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar8 = *pGVar1->vCos->pArray;
  if ((-1 < iVar8) && (iVar8 < pGVar1->nObjs)) {
    Vec_IntPush(vCos,iVar8);
    pVVar7 = p->vAbs;
    if (0 < pVVar7->nSize) {
      lVar13 = 0;
      do {
        iVar8 = pVVar7->pArray[lVar13];
        if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_005876d2:
          __assert_fail("i >= 0 && i < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
        }
        if (iVar8 == 0) {
          pGVar12 = (Gla_Obj_t *)0x0;
        }
        else {
          pGVar12 = p->pObjs + iVar8;
        }
        uVar11 = *(uint *)&pGVar12->field_0x4;
        if ((uVar11 & 0xa4) == 0) {
          __assert_fail("pObj->fConst || pObj->fRo || pObj->fAnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0xf0,
                        "void Gla_ManCollect(Gla_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        if ((uVar11 & 0x20) != 0) {
          iVar8 = pGVar12->iGiaObj;
          if ((long)iVar8 < 0) goto LAB_005876f1;
          pGVar1 = p->pGia;
          if (pGVar1->nObjs <= iVar8) goto LAB_005876f1;
          if ((~(uint)*(undefined8 *)(pGVar1->pObjs + iVar8) & 0x9fffffff) != 0) {
LAB_0058774e:
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar11 = (uint)((ulong)*(undefined8 *)(pGVar1->pObjs + iVar8) >> 0x20) & 0x1fffffff;
          iVar8 = pGVar1->vCis->nSize;
          if ((int)uVar11 < iVar8 - pGVar1->nRegs) goto LAB_0058774e;
          iVar6 = pGVar1->vCos->nSize;
          uVar11 = (iVar6 - iVar8) + uVar11;
          if (((int)uVar11 < 0) || (iVar6 <= (int)uVar11)) goto LAB_0058776d;
          uVar11 = pGVar1->vCos->pArray[uVar11];
          if (((int)uVar11 < 0) || ((uint)pGVar1->nObjs <= uVar11)) goto LAB_005876f1;
          Vec_IntPush(vCos,uVar11);
          uVar11 = *(uint *)&pGVar12->field_0x4;
        }
        if (0x1ff < uVar11) {
          uVar14 = 0;
          do {
            iVar8 = pGVar12->Fanins[uVar14];
            if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_005876d2;
            if (iVar8 == 0) {
              pGVar9 = (Gla_Obj_t *)0x0;
            }
            else {
              pGVar9 = p->pObjs + iVar8;
            }
            if ((*(uint *)&pGVar9->field_0x4 & 1) == 0) {
              pVVar7 = vPPis;
              if ((*(uint *)&pGVar9->field_0x4 & 8) != 0) {
                pVVar7 = vPis;
              }
              Vec_IntPush(pVVar7,pGVar9->iGiaObj);
              uVar11 = *(uint *)&pGVar12->field_0x4;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < uVar11 >> 9);
        }
        lVar13 = lVar13 + 1;
        pVVar7 = p->vAbs;
      } while (lVar13 < pVVar7->nSize);
    }
    if (1 < (long)vPis->nSize) {
      qsort(vPis->pArray,(long)vPis->nSize,4,Vec_IntSortCompare1);
      iVar8 = vPis->nSize;
      iVar6 = 1;
      if (1 < iVar8) {
        piVar2 = vPis->pArray;
        lVar13 = 1;
        do {
          if (piVar2[lVar13] != piVar2[lVar13 + -1]) {
            lVar10 = (long)iVar6;
            iVar6 = iVar6 + 1;
            piVar2[lVar10] = piVar2[lVar13];
            iVar8 = vPis->nSize;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < iVar8);
      }
      vPis->nSize = iVar6;
    }
    if (1 < (long)vPPis->nSize) {
      qsort(vPPis->pArray,(long)vPPis->nSize,4,Vec_IntSortCompare1);
      iVar8 = vPPis->nSize;
      iVar6 = 1;
      if (1 < iVar8) {
        piVar2 = vPPis->pArray;
        lVar13 = 1;
        do {
          if (piVar2[lVar13] != piVar2[lVar13 + -1]) {
            lVar10 = (long)iVar6;
            iVar6 = iVar6 + 1;
            piVar2[lVar10] = piVar2[lVar13];
            iVar8 = vPPis->nSize;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < iVar8);
      }
      vPPis->nSize = iVar6;
    }
    qsort(vCos->pArray,(long)vCos->nSize,4,Vec_IntSortCompare1);
    Gia_ManIncrementTravId(p->pGia);
    pGVar1 = p->pGia;
    if (pGVar1->nObjs < 1) {
LAB_005877ab:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (pGVar1->nTravIdsAlloc < 1) {
LAB_00587710:
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x23a,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar3 = pGVar1->pObjs;
    iVar8 = pGVar1->nTravIds;
    piVar2 = pGVar1->pTravIds;
    *piVar2 = iVar8;
    if (0 < vPis->nSize) {
      piVar4 = vPis->pArray;
      lVar13 = 0;
      do {
        iVar6 = piVar4[lVar13];
        if (((long)iVar6 < 0) || (pGVar1->nObjs <= iVar6)) goto LAB_005876f1;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        if (pGVar1->nTravIdsAlloc <= iVar6) goto LAB_00587710;
        piVar2[iVar6] = iVar8;
        lVar13 = lVar13 + 1;
      } while (lVar13 < vPis->nSize);
    }
    if (0 < vPPis->nSize) {
      piVar4 = vPPis->pArray;
      lVar13 = 0;
      do {
        iVar6 = piVar4[lVar13];
        if (((long)iVar6 < 0) || (pGVar1->nObjs <= iVar6)) goto LAB_005876f1;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        if (pGVar1->nTravIdsAlloc <= iVar6) goto LAB_00587710;
        piVar2[iVar6] = iVar8;
        lVar13 = lVar13 + 1;
      } while (lVar13 < vPPis->nSize);
    }
    iVar8 = vCos->nSize;
    if (0 < iVar8) {
      lVar13 = 0;
      do {
        iVar6 = vCos->pArray[lVar13];
        if ((long)iVar6 < 0) goto LAB_005876f1;
        pGVar1 = p->pGia;
        if (pGVar1->nObjs <= iVar6) goto LAB_005876f1;
        if (pGVar1->pObjs == (Gia_Obj_t *)0x0) break;
        if (lVar13 != 0) {
          uVar5 = *(undefined8 *)(pGVar1->pObjs + iVar6);
          uVar11 = (uint)uVar5;
          if ((-1 < (int)uVar11) || ((uVar11 & 0x1fffffff) == 0x1fffffff)) {
LAB_0058778c:
            __assert_fail("Gia_ObjIsRi(p, pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1dc,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar11 = (uint)((ulong)uVar5 >> 0x20) & 0x1fffffff;
          iVar8 = pGVar1->vCos->nSize;
          if ((int)uVar11 < iVar8 - pGVar1->nRegs) goto LAB_0058778c;
          iVar6 = pGVar1->vCis->nSize;
          uVar11 = (iVar6 - iVar8) + uVar11;
          if (((int)uVar11 < 0) || (iVar6 <= (int)uVar11)) goto LAB_0058776d;
          uVar11 = pGVar1->vCis->pArray[uVar11];
          if (((long)(int)uVar11 < 0) || ((uint)pGVar1->nObjs <= uVar11)) goto LAB_005876f1;
          if (pGVar1->nTravIdsAlloc <= (int)uVar11) goto LAB_00587710;
          pGVar1->pTravIds[(int)uVar11] = pGVar1->nTravIds;
          if (pGVar1->nObjs <= (int)uVar11) goto LAB_005877ab;
          Vec_IntPush(vRoAnds,uVar11);
          iVar8 = vCos->nSize;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < iVar8);
      if (0 < iVar8) {
        lVar13 = 0;
        do {
          iVar8 = vCos->pArray[lVar13];
          if (((long)iVar8 < 0) || (pGVar1 = p->pGia, pGVar1->nObjs <= iVar8)) goto LAB_005876f1;
          if (pGVar1->pObjs == (Gia_Obj_t *)0x0) {
            return;
          }
          pGVar3 = pGVar1->pObjs + iVar8;
          Gla_ManCollectInternal_rec
                    (pGVar1,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff),vRoAnds);
          lVar13 = lVar13 + 1;
        } while (lVar13 < vCos->nSize);
      }
    }
    return;
  }
LAB_005876f1:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Gla_ManCollect( Gla_Man_t * p, Vec_Int_t * vPis, Vec_Int_t * vPPis, Vec_Int_t * vCos, Vec_Int_t * vRoAnds )
{
    Gla_Obj_t * pObj, * pFanin; 
    Gia_Obj_t * pGiaObj;
    int i, k;

    // collect COs
    Vec_IntPush( vCos, Gia_ObjId(p->pGia, Gia_ManPo(p->pGia, 0)) );
    // collect fanins of abstracted objects
    Gla_ManForEachObjAbs( p, pObj, i )
    {
        assert( pObj->fConst || pObj->fRo || pObj->fAnd );
        if ( pObj->fRo )
        {
            pGiaObj = Gia_ObjRoToRi( p->pGia, Gia_ManObj(p->pGia, pObj->iGiaObj) );
            Vec_IntPush( vCos, Gia_ObjId(p->pGia, pGiaObj) );
        }
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            if ( !pFanin->fAbs )
                Vec_IntPush( (pFanin->fPi ? vPis : vPPis), pFanin->iGiaObj );
    }
    Vec_IntUniqify( vPis );
    Vec_IntUniqify( vPPis );
    Vec_IntSort( vCos, 0 );
    // sorting PIs/PPIs/COs leads to refinements that are more "well-aligned"...

    // mark const/PIs/PPIs
    Gia_ManIncrementTravId( p->pGia );
    Gia_ObjSetTravIdCurrent( p->pGia, Gia_ManConst0(p->pGia) );
    Gia_ManForEachObjVec( vPis, p->pGia, pGiaObj, i )
        Gia_ObjSetTravIdCurrent( p->pGia, pGiaObj );
    Gia_ManForEachObjVec( vPPis, p->pGia, pGiaObj, i )
        Gia_ObjSetTravIdCurrent( p->pGia, pGiaObj );
    // mark and add ROs first
    Gia_ManForEachObjVec( vCos, p->pGia, pGiaObj, i )
    {
        if ( i == 0 ) continue;
        pGiaObj = Gia_ObjRiToRo( p->pGia, pGiaObj );
        Gia_ObjSetTravIdCurrent( p->pGia, pGiaObj );
        Vec_IntPush( vRoAnds, Gia_ObjId(p->pGia, pGiaObj) );
    }
    // collect nodes between PIs/PPIs/ROs and COs
    Gia_ManForEachObjVec( vCos, p->pGia, pGiaObj, i )
        Gla_ManCollectInternal_rec( p->pGia, Gia_ObjFanin0(pGiaObj), vRoAnds );
}